

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O2

unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> cmCryptoHash::New(string_view algo)

{
  bool bVar1;
  char *in_RDX;
  char *pcVar2;
  __uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true> __args;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  
  pcVar2 = algo._M_str;
  __args.super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>._M_t.
  super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
  super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl =
       (__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>)algo._M_len;
  __y._M_str = "MD5";
  __y._M_len = 3;
  __x._M_str = in_RDX;
  __x._M_len = (size_t)pcVar2;
  bVar1 = std::operator==(__x,__y);
  if ((((((bVar1) ||
         (__y_00._M_str = "SHA1", __y_00._M_len = 4, __x_00._M_str = in_RDX,
         __x_00._M_len = (size_t)pcVar2, bVar1 = std::operator==(__x_00,__y_00), bVar1)) ||
        (__y_01._M_str = "SHA224", __y_01._M_len = 6, __x_01._M_str = in_RDX,
        __x_01._M_len = (size_t)pcVar2, bVar1 = std::operator==(__x_01,__y_01), bVar1)) ||
       ((__y_02._M_str = "SHA256", __y_02._M_len = 6, __x_02._M_str = in_RDX,
        __x_02._M_len = (size_t)pcVar2, bVar1 = std::operator==(__x_02,__y_02), bVar1 ||
        (__y_03._M_str = "SHA384", __y_03._M_len = 6, __x_03._M_str = in_RDX,
        __x_03._M_len = (size_t)pcVar2, bVar1 = std::operator==(__x_03,__y_03), bVar1)))) ||
      ((__y_04._M_str = "SHA512", __y_04._M_len = 6, __x_04._M_str = in_RDX,
       __x_04._M_len = (size_t)pcVar2, bVar1 = std::operator==(__x_04,__y_04), bVar1 ||
       ((__y_05._M_str = "SHA3_224", __y_05._M_len = 8, __x_05._M_str = in_RDX,
        __x_05._M_len = (size_t)pcVar2, bVar1 = std::operator==(__x_05,__y_05), bVar1 ||
        (__y_06._M_str = "SHA3_256", __y_06._M_len = 8, __x_06._M_str = in_RDX,
        __x_06._M_len = (size_t)pcVar2, bVar1 = std::operator==(__x_06,__y_06), bVar1)))))) ||
     ((__y_07._M_str = "SHA3_384", __y_07._M_len = 8, __x_07._M_str = in_RDX,
      __x_07._M_len = (size_t)pcVar2, bVar1 = std::operator==(__x_07,__y_07), bVar1 ||
      (__y_08._M_str = "SHA3_512", __y_08._M_len = 8, __x_08._M_str = in_RDX,
      __x_08._M_len = (size_t)pcVar2, bVar1 = std::operator==(__x_08,__y_08), bVar1)))) {
    std::make_unique<cmCryptoHash,cmCryptoHash::Algo>
              ((Algo *)__args.
                       super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>._M_t.
                       super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
                       super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl);
  }
  else {
    *(undefined8 *)
     __args.super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>._M_t.
     super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
     super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl = 0;
  }
  return (__uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true>)
         (tuple<cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>)
         __args.super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>._M_t.
         super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
         super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<cmCryptoHash> cmCryptoHash::New(cm::string_view algo)
{
  if (algo == "MD5") {
    return cm::make_unique<cmCryptoHash>(AlgoMD5);
  }
  if (algo == "SHA1") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA1);
  }
  if (algo == "SHA224") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA224);
  }
  if (algo == "SHA256") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA256);
  }
  if (algo == "SHA384") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA384);
  }
  if (algo == "SHA512") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA512);
  }
  if (algo == "SHA3_224") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_224);
  }
  if (algo == "SHA3_256") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_256);
  }
  if (algo == "SHA3_384") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_384);
  }
  if (algo == "SHA3_512") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_512);
  }
  return std::unique_ptr<cmCryptoHash>(nullptr);
}